

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O2

void serialization::
     serialize_container_helper<serialization::xml_oarchive,std::vector<int,std::allocator<int>>>
               (xml_oarchive *ar,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  int *i;
  pointer obj;
  
  xml_oarchive::save_sequence_start
            (ar,(size_type)
                ((ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2));
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (obj = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start; obj != piVar1; obj = obj + 1) {
    xml_oarchive::save_sequence_item_start(ar);
    serialize_helper<serialization::xml_oarchive,int>(ar,obj);
    ar->current_ = (ar->current_->super_xml_base<char>).m_parent;
  }
  ar->current_ = (ar->current_->super_xml_base<char>).m_parent;
  return;
}

Assistant:

inline void serialize_container_helper(Archive & ar, const T & v)
{
    serialization_trace trace(__func__, __FILE__, __LINE__);

    ar.save_sequence_start(v.size());
    for(const auto & i : v)
    {
        ar.save_sequence_item_start();
        serialize_helper(ar, i);
        ar.save_sequence_item_end();
    }
    ar.save_sequence_end();
}